

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLib.c
# Opt level: O2

JL_STATUS JlFreeJsonStringBuffer(char **pJsonStringBuffer)

{
  JL_STATUS JVar1;
  
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if ((pJsonStringBuffer != (char **)0x0) && (*pJsonStringBuffer != (char *)0x0)) {
    WjTestLib_Free(*pJsonStringBuffer);
    *pJsonStringBuffer = (char *)0x0;
    JVar1 = JL_STATUS_SUCCESS;
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlFreeJsonStringBuffer
    (
        char**                  pJsonStringBuffer
    )
{
    JL_STATUS jlStatus;

    if(     NULL != pJsonStringBuffer
        &&  NULL != *pJsonStringBuffer )
    {
        JlFree( *pJsonStringBuffer );
        *pJsonStringBuffer = NULL;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}